

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O3

Type * __thiscall
QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_>::operator->
          (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_> *this)

{
  int iVar1;
  
  if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>>::instance()::
      holder == '\0') {
    iVar1 = __cxa_guard_acquire(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>>
                                 ::instance()::holder);
    if (iVar1 != 0) {
      QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>>::instance()::
      holder = newBackendTimeZone();
      LOCK();
      (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>>::instance()::
       holder->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>>::
            instance()::holder->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      __cxa_atexit(QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>::~Holder,
                   &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>>::
                    instance()::holder,&__dso_handle);
      __cxa_guard_release(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>>
                           ::instance()::holder);
    }
  }
  return (Type *)&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>>::
                  instance()::holder;
}

Assistant:

static Type *instance() noexcept(Holder::ConstructionIsNoexcept)
    {
        static Holder holder;
        return holder.pointer();
    }